

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

void __thiscall
slang::ast::HierarchicalValueExpression::HierarchicalValueExpression
          (HierarchicalValueExpression *this,Scope *scope,ValueSymbol *symbol,
          HierarchicalReference *ref,SourceRange sourceRange)

{
  Expression *pEVar1;
  pointer pEVar2;
  size_t sVar3;
  bool bVar4;
  Type *pTVar5;
  
  pTVar5 = DeclaredType::getType(&symbol->declaredType);
  (this->super_ValueExpressionBase).super_Expression.kind = HierarchicalValue;
  (this->super_ValueExpressionBase).super_Expression.type.ptr = pTVar5;
  (this->super_ValueExpressionBase).super_Expression.constant = (ConstantValue *)0x0;
  (this->super_ValueExpressionBase).super_Expression.syntax = (ExpressionSyntax *)0x0;
  (this->super_ValueExpressionBase).super_Expression.sourceRange.startLoc = sourceRange.startLoc;
  (this->super_ValueExpressionBase).super_Expression.sourceRange.endLoc = sourceRange.endLoc;
  (this->super_ValueExpressionBase).symbol = symbol;
  pEVar1 = ref->expr;
  pEVar2 = (ref->path)._M_ptr;
  sVar3 = (ref->path)._M_extent._M_extent_value;
  (this->ref).target = ref->target;
  (this->ref).expr = pEVar1;
  (this->ref).path._M_ptr = pEVar2;
  (this->ref).path._M_extent._M_extent_value = sVar3;
  (this->ref).upwardCount = ref->upwardCount;
  (this->ref).expr = (Expression *)this;
  bVar4 = HierarchicalReference::isUpward(&this->ref);
  if (bVar4) {
    Compilation::noteUpwardReference(scope->compilation,scope,&this->ref);
    return;
  }
  return;
}

Assistant:

HierarchicalValueExpression::HierarchicalValueExpression(const Scope& scope,
                                                         const ValueSymbol& symbol,
                                                         const HierarchicalReference& ref,
                                                         SourceRange sourceRange) :
    ValueExpressionBase(ExpressionKind::HierarchicalValue, symbol, sourceRange), ref(ref) {
    SLANG_ASSERT(ref.target == &symbol);
    this->ref.expr = this;

    if (this->ref.isUpward())
        scope.getCompilation().noteUpwardReference(scope, this->ref);
}